

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlUnmarshall.c
# Opt level: O2

JL_STATUS FreeUnmarshalledDictionary
                    (JlMarshallElement *StructDescription,size_t StructDescriptionCount,
                    void *Structure)

{
  JlMarshallElement *Description;
  JL_DATA_TYPE JVar1;
  JL_STATUS JVar2;
  ulong in_RAX;
  size_t ListCount;
  ulong extraout_RAX;
  void *CountFieldPtr;
  char **stringPtr;
  undefined8 *Structure_00;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  do {
    uVar4 = (ulong)uVar3;
    if (StructDescriptionCount <= uVar4) {
      return (JL_STATUS)in_RAX;
    }
    Description = StructDescription + uVar4;
    Structure_00 = (undefined8 *)(StructDescription[uVar4].FieldOffset + (long)Structure);
    if (StructDescription[uVar4].IsArray == true) {
      CountFieldPtr = (void *)(Description->CountFieldOffset + (long)Structure);
      ListCount = JlMemoryReadCountValue(CountFieldPtr,Description->CountFieldSize);
      FreeUnmarshalledList(Description,Structure_00,ListCount);
      JVar2 = JlMemoryWriteCountValue(CountFieldPtr,Description->CountFieldSize,0);
LAB_0011c15f:
      in_RAX = (ulong)(uint)JVar2;
    }
    else {
      JVar1 = Description->Type;
      in_RAX = (ulong)JVar1;
      if (JVar1 == JL_DATA_TYPE_STRING) {
        if ((Description->FieldSize == 0) && ((void *)*Structure_00 != (void *)0x0)) {
          WjTestLib_Free((void *)*Structure_00);
          *Structure_00 = 0;
          in_RAX = extraout_RAX;
        }
      }
      else if (JVar1 == JL_DATA_TYPE_DICTIONARY) {
        JVar2 = FreeUnmarshalledDictionary
                          (Description->ChildStructDescription,
                           (ulong)Description->ChildStructDescriptionCount,Structure_00);
        goto LAB_0011c15f;
      }
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

static
JL_STATUS
    FreeUnmarshalledDictionary
    (
        JlMarshallElement const*    StructDescription,
        size_t                      StructDescriptionCount,
        void*                       Structure
    )
{
    JL_STATUS jlStatus = JL_STATUS_SUCCESS;

    for( uint32_t i=0; i<StructDescriptionCount && JL_STATUS_SUCCESS==jlStatus; i++ )
    {
        JlMarshallElement const* itemDescription = &StructDescription[i];
        JL_DATA_TYPE type = itemDescription->Type;
        void* itemPtr = ((uint8_t*)Structure)+itemDescription->FieldOffset;

        if( itemDescription->IsArray )
        {
            void* countFieldPtr = ((uint8_t*)Structure) + itemDescription->CountFieldOffset;
            size_t arrayCount = JlMemoryReadCountValue( countFieldPtr, itemDescription->CountFieldSize );
            jlStatus = FreeUnmarshalledList( itemDescription, itemPtr, arrayCount );
            (void) JlMemoryWriteCountValue( countFieldPtr, itemDescription->CountFieldSize, 0 );
        }
        else if( JL_DATA_TYPE_DICTIONARY == type )
        {
            jlStatus = FreeUnmarshalledDictionary( itemDescription->ChildStructDescription, itemDescription->ChildStructDescriptionCount, itemPtr );
        }
        else if( JL_DATA_TYPE_STRING == type )
        {
            if( 0 == itemDescription->FieldSize )
            {
                // 0 means that itemPtr is pointing to a char* that was allocated
                char** stringPtr = itemPtr;
                if( NULL != *stringPtr )
                {
                    JlFree( *stringPtr );
                    *stringPtr = NULL;
                }
                jlStatus = JL_STATUS_SUCCESS;
            }
            else
            {
                // Fixed sized string in struct, so we don't deallocate it
                jlStatus = JL_STATUS_SUCCESS;
            }
        }
        else
        {
            // Is a Number, Bool. These are not allocated
            jlStatus = JL_STATUS_SUCCESS;
        }
    }

    return jlStatus;
}